

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_uniform_initializers.cpp
# Opt level: O0

void linker::set_opaque_binding
               (void *mem_ctx,gl_shader_program *prog,ir_variable *var,glsl_type *type,char *name,
               int *binding)

{
  int iVar1;
  glsl_type *type_00;
  gl_linked_shader *pgVar2;
  bool bVar3;
  uint uVar4;
  char *name_00;
  gl_uniform_storage *pgVar5;
  uint local_84;
  uint local_7c;
  uint index_1;
  uint i_3;
  uint index;
  uint i_2;
  gl_linked_shader *shader;
  uint local_60;
  int sh;
  uint i_1;
  uint elements;
  gl_uniform_storage *storage;
  char *element_name;
  uint i;
  glsl_type *element_type;
  int *binding_local;
  char *name_local;
  glsl_type *type_local;
  ir_variable *var_local;
  gl_shader_program *prog_local;
  void *mem_ctx_local;
  
  bVar3 = glsl_type::is_array(type);
  if ((bVar3) && (bVar3 = glsl_type::is_array((type->fields).array), bVar3)) {
    type_00 = (type->fields).array;
    for (element_name._4_4_ = 0; element_name._4_4_ < type->length;
        element_name._4_4_ = element_name._4_4_ + 1) {
      name_00 = ralloc_asprintf(mem_ctx,"%s[%d]",name,(ulong)element_name._4_4_);
      set_opaque_binding(mem_ctx,prog,var,type_00,name_00,binding);
    }
  }
  else {
    pgVar5 = get_storage(prog,name);
    if (pgVar5 != (gl_uniform_storage *)0x0) {
      if (pgVar5->array_elements < 2) {
        local_84 = 1;
      }
      else {
        local_84 = pgVar5->array_elements;
      }
      for (local_60 = 0; local_60 < local_84; local_60 = local_60 + 1) {
        iVar1 = *binding;
        *binding = iVar1 + 1;
        pgVar5->storage[local_60].b = iVar1;
      }
      for (shader._4_4_ = 0; shader._4_4_ < 6; shader._4_4_ = shader._4_4_ + 1) {
        pgVar2 = prog->_LinkedShaders[shader._4_4_];
        if ((pgVar2 != (gl_linked_shader *)0x0) && ((pgVar5->opaque[shader._4_4_].active & 1U) != 0)
           ) {
          bVar3 = glsl_type::is_sampler(pgVar5->type);
          if (bVar3) {
            for (i_3 = 0; i_3 < local_84; i_3 = i_3 + 1) {
              uVar4 = pgVar5->opaque[shader._4_4_].index + i_3;
              if (((byte)(var->data).field_0x6 >> 2 & 1) == 0) {
                if (0x1f < uVar4) break;
                pgVar2->Program->SamplerUnits[uVar4] = (GLubyte)pgVar5->storage[i_3].b;
              }
              else {
                if ((pgVar2->Program->field_20).sh.NumBindlessSamplers <= uVar4) break;
                (pgVar2->Program->field_20).sh.BindlessSamplers[uVar4].unit =
                     (GLubyte)pgVar5->storage[i_3].b;
                (pgVar2->Program->field_20).sh.BindlessSamplers[uVar4].bound = '\x01';
                (pgVar2->Program->field_20).sh.HasBoundBindlessSampler = '\x01';
              }
            }
          }
          else {
            bVar3 = glsl_type::is_image(pgVar5->type);
            if (bVar3) {
              for (local_7c = 0; local_7c < local_84; local_7c = local_7c + 1) {
                uVar4 = pgVar5->opaque[shader._4_4_].index + local_7c;
                if (((byte)(var->data).field_0x6 >> 2 & 1) == 0) {
                  if (0x1f < uVar4) break;
                  (pgVar2->Program->field_20).sh.ImageUnits[uVar4] =
                       (GLubyte)pgVar5->storage[local_7c].b;
                }
                else {
                  if ((pgVar2->Program->field_20).sh.NumBindlessImages <= uVar4) break;
                  (pgVar2->Program->field_20).sh.BindlessImages[uVar4].unit =
                       (GLubyte)pgVar5->storage[local_7c].b;
                  (pgVar2->Program->field_20).sh.BindlessImages[uVar4].bound = '\x01';
                  (pgVar2->Program->field_20).sh.HasBoundBindlessImage = '\x01';
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
set_opaque_binding(void *mem_ctx, gl_shader_program *prog,
                   const ir_variable *var, const glsl_type *type,
                   const char *name, int *binding)
{

   if (type->is_array() && type->fields.array->is_array()) {
      const glsl_type *const element_type = type->fields.array;

      for (unsigned int i = 0; i < type->length; i++) {
         const char *element_name = ralloc_asprintf(mem_ctx, "%s[%d]", name, i);

         set_opaque_binding(mem_ctx, prog, var, element_type,
                            element_name, binding);
      }
   } else {
      struct gl_uniform_storage *const storage = get_storage(prog, name);

      if (!storage)
         return;

      const unsigned elements = MAX2(storage->array_elements, 1);

      /* Section 4.4.6 (Opaque-Uniform Layout Qualifiers) of the GLSL 4.50 spec
       * says:
       *
       *     "If the binding identifier is used with an array, the first element
       *     of the array takes the specified unit and each subsequent element
       *     takes the next consecutive unit."
       */
      for (unsigned int i = 0; i < elements; i++) {
         storage->storage[i].i = (*binding)++;
      }

      for (int sh = 0; sh < MESA_SHADER_STAGES; sh++) {
         gl_linked_shader *shader = prog->_LinkedShaders[sh];

         if (!shader)
            continue;
         if (!storage->opaque[sh].active)
            continue;

         if (storage->type->is_sampler()) {
            for (unsigned i = 0; i < elements; i++) {
               const unsigned index = storage->opaque[sh].index + i;

               if (var->data.bindless) {
                  if (index >= shader->Program->sh.NumBindlessSamplers)
                     break;
                  shader->Program->sh.BindlessSamplers[index].unit =
                     storage->storage[i].i;
                  shader->Program->sh.BindlessSamplers[index].bound = true;
                  shader->Program->sh.HasBoundBindlessSampler = true;
               } else {
                  if (index >= ARRAY_SIZE(shader->Program->SamplerUnits))
                     break;
                  shader->Program->SamplerUnits[index] =
                     storage->storage[i].i;
               }
            }
         } else if (storage->type->is_image()) {
            for (unsigned i = 0; i < elements; i++) {
               const unsigned index = storage->opaque[sh].index + i;


               if (var->data.bindless) {
                  if (index >= shader->Program->sh.NumBindlessImages)
                     break;
                  shader->Program->sh.BindlessImages[index].unit =
                     storage->storage[i].i;
                  shader->Program->sh.BindlessImages[index].bound = true;
                  shader->Program->sh.HasBoundBindlessImage = true;
               } else {
                  if (index >= ARRAY_SIZE(shader->Program->sh.ImageUnits))
                     break;
                  shader->Program->sh.ImageUnits[index] =
                     storage->storage[i].i;
               }
            }
         }
      }
   }
}